

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O3

int sysbvm_integer_compare(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  sysbvm_decoded_integer_t decodedRightInteger;
  sysbvm_decoded_integer_t decodedLeftInteger;
  sysbvm_decoded_integer_t local_68;
  sysbvm_decoded_integer_t local_48;
  
  if ((right & 0xf) == 0 || (left & 0xf) == 0) {
    local_48.words = (uint32_t *)0x0;
    local_48.inlineWordBuffer[0] = 0;
    local_48.inlineWordBuffer[1] = 0;
    local_48.isNegative = false;
    local_48._1_7_ = 0;
    local_48.wordCount = 0;
    local_68.words = (uint32_t *)0x0;
    local_68.inlineWordBuffer[0] = 0;
    local_68.inlineWordBuffer[1] = 0;
    local_68.isNegative = false;
    local_68._1_7_ = 0;
    local_68.wordCount = 0;
    sysbvm_integer_decodeLargeOrImmediate(context,&local_48,left);
    sysbvm_integer_decodeLargeOrImmediate(context,&local_68,right);
    if (local_48.isNegative == local_68.isNegative) {
      uVar1 = local_68.wordCount;
      if (local_68.wordCount < local_48.wordCount) {
        uVar1 = local_48.wordCount;
      }
      do {
        if (uVar1 == 0) {
          uVar2 = 0;
          goto LAB_0011ed6d;
        }
        uVar1 = uVar1 - 1;
        uVar2 = 0;
        uVar3 = 0;
        if (uVar1 < local_48.wordCount) {
          uVar3 = local_48.words[uVar1];
        }
        if (uVar1 < local_68.wordCount) {
          uVar2 = local_68.words[uVar1];
        }
        if (uVar3 < uVar2) {
          uVar2 = 0xffffffff;
          goto LAB_0011ed6d;
        }
      } while (uVar3 <= uVar2);
      uVar2 = 1;
LAB_0011ed6d:
      uVar3 = -uVar2;
      if (local_48.isNegative == false) {
        uVar3 = uVar2;
      }
    }
    else {
      uVar3 = -(uint)local_48.isNegative | 1;
    }
  }
  else {
    uVar3 = 0xffffffff;
    if ((long)right >> 4 <= (long)left >> 4) {
      uVar3 = (uint)((long)right >> 4 < (long)left >> 4);
    }
  }
  return uVar3;
}

Assistant:

SYSBVM_API int sysbvm_integer_compare(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_tuple_isImmediate(left) && sysbvm_tuple_isImmediate(right))
    {
        sysbvm_stuple_t leftValue = sysbvm_tuple_integer_decodeSmall(left);
        sysbvm_stuple_t rightValue = sysbvm_tuple_integer_decodeSmall(right);
        if(leftValue < rightValue)
            return -1;
        else if(leftValue > rightValue)
            return 1;
        else
            return 0;
    }

    sysbvm_decoded_integer_t decodedLeftInteger = {0};
    sysbvm_decoded_integer_t decodedRightInteger = {0};
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedLeftInteger, left);
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedRightInteger, right);

    // Check the differing signs.
    if(decodedLeftInteger.isNegative != decodedRightInteger.isNegative)
    {
        if(decodedLeftInteger.isNegative)
            return -1;
        else
            return 1;
    }

    // Check the word count.
    int magnitudeComparison = sysbvm_integer_compareMagnitudes(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words);
    if(decodedLeftInteger.isNegative)
        magnitudeComparison = -magnitudeComparison;

    return magnitudeComparison;
}